

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
** __thiscall
phmap::priv::
btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
::mutable_child(btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
                *this,size_type i)

{
  CopyConst<char,_ElementType<3UL>_> *ppbVar1;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  if (((ulong)this & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                  ,0xf84,
                  "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>> *, unsigned char, phmap::priv::map_slot_type<int, std::basic_string<char>>, phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
                 );
  }
  if (this[0xb] ==
      (btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
       )0x0) {
    local_28 = 1;
    local_20 = 4;
    local_18 = 6;
    local_10 = 7;
    ppbVar1 = internal_layout::
              LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>*,unsigned_char,phmap::priv::map_slot_type<int,std::__cxx11::string>,phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>*>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
              ::Pointer<3ul,char>((LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>*,unsigned_char,phmap::priv::map_slot_type<int,std::__cxx11::string>,phmap::priv::btree_node<phmap::priv::map_params<int,std::__cxx11::string,phmap::Less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>,256,false>>*>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>,phmap::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul>>
                                   *)&local_28,(char *)this);
    return (btree_node<phmap::priv::map_params<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::Less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_256,_false>_>
            **)(ppbVar1 + i);
  }
  __assert_fail("N < 3 || !leaf()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0x47c,
                "typename layout_type::template ElementType<N> *phmap::priv::btree_node<phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>>::GetField() [Params = phmap::priv::map_params<int, std::basic_string<char>, phmap::Less<int>, std::allocator<std::pair<const int, std::basic_string<char>>>, 256, false>, N = 3UL]"
               );
}

Assistant:

btree_node *&mutable_child(size_type i) { return GetField<3>()[i]; }